

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

HTS_Boolean HTS_pattern_match(char *string,char *pattern)

{
  HTS_Boolean HVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  char buff [1024];
  undefined8 uStack_430;
  char acStack_428 [1032];
  
  uStack_430 = 0x10a115;
  sVar2 = strlen(pattern);
  if (sVar2 == 0) {
    sVar2 = 0;
    lVar7 = 0;
    bVar8 = false;
  }
  else {
    lVar3 = 0;
    lVar5 = 0;
    lVar7 = 0;
    sVar6 = 0;
    do {
      if (pattern[sVar6] == '?') {
        lVar3 = lVar3 + 1;
LAB_0010a13d:
        lVar7 = lVar7 + 1;
      }
      else {
        if (pattern[sVar6] != '*') goto LAB_0010a13d;
        lVar5 = lVar5 + 1;
      }
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
    bVar8 = lVar5 == 2 && lVar3 == 0;
  }
  if (((bVar8) && (*pattern == '*')) && (pattern[sVar2 - 1] == '*')) {
    if (sVar2 - 2 != 0) {
      uStack_430 = 0x10a185;
      memcpy(acStack_428,pattern + 1,sVar2 - 2);
    }
    acStack_428[sVar2 - 2] = '\0';
    uStack_430 = 0x10a195;
    pcVar4 = strstr(string,acStack_428);
    return pcVar4 != (char *)0x0;
  }
  uStack_430 = 0x10a1b2;
  sVar2 = strlen(string);
  HVar1 = HTS_dp_match(string,pattern,0,sVar2 - lVar7);
  return HVar1;
}

Assistant:

static HTS_Boolean HTS_pattern_match(const char *string, const char *pattern)
{
   size_t i, j;
   size_t buff_length, max = 0, nstar = 0, nquestion = 0;
   char buff[HTS_MAXBUFLEN];
   size_t pattern_length = strlen(pattern);

   for (i = 0; i < pattern_length; i++) {
      switch (pattern[i]) {
      case '*':
         nstar++;
         break;
      case '?':
         nquestion++;
         max++;
         break;
      default:
         max++;
      }
   }
   if (nstar == 2 && nquestion == 0 && pattern[0] == '*' && pattern[i - 1] == '*') {
      /* only string matching is required */
      buff_length = i - 2;
      for (i = 0, j = 1; i < buff_length; i++, j++)
         buff[i] = pattern[j];
      buff[buff_length] = '\0';
      if (strstr(string, buff) != NULL)
         return TRUE;
      else
         return FALSE;
   } else
      return HTS_dp_match(string, pattern, 0, strlen(string) - max);
}